

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::avx::SphereMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar8;
  uint uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  RTCRayN *pRVar12;
  undefined1 (*pauVar14) [16];
  long lVar15;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar26;
  float fVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  vbool<4> valid;
  undefined1 local_248 [16];
  undefined1 (*local_230) [16];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  undefined1 local_d8 [16];
  HitK<4> h;
  ulong uVar13;
  undefined1 auVar40 [64];
  undefined1 auVar42 [64];
  undefined1 auVar46 [64];
  
  pSVar5 = context->scene;
  pGVar6 = (pSVar5->geometries).items[sphere->sharedGeomID].ptr;
  lVar15 = *(long *)&pGVar6->field_0x58;
  _Var7 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar22 = *(undefined1 (*) [16])(lVar15 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar20 = *(undefined1 (*) [16])(lVar15 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar43 = *(undefined1 (*) [16])(lVar15 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar45 = *(undefined1 (*) [16])(lVar15 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar29 = vunpcklps_avx(auVar22,auVar43);
  auVar22 = vunpckhps_avx(auVar22,auVar43);
  auVar43 = vunpcklps_avx(auVar20,auVar45);
  auVar20 = vunpckhps_avx(auVar20,auVar45);
  auVar45 = vunpcklps_avx(auVar29,auVar43);
  auVar43 = vunpckhps_avx(auVar29,auVar43);
  auVar18 = vunpcklps_avx(auVar22,auVar20);
  auVar31 = vunpckhps_avx(auVar22,auVar20);
  auVar22 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar20 = vpcmpgtd_avx(auVar22,_DAT_01f4ad30);
  local_d8 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar11 = *(undefined4 *)(ray + k * 4);
  auVar38._4_4_ = uVar11;
  auVar38._0_4_ = uVar11;
  auVar38._8_4_ = uVar11;
  auVar38._12_4_ = uVar11;
  auVar45 = vsubps_avx(auVar45,auVar38);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar29._4_4_ = uVar11;
  auVar29._0_4_ = uVar11;
  auVar29._8_4_ = uVar11;
  auVar29._12_4_ = uVar11;
  auVar29 = vsubps_avx(auVar43,auVar29);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar22._4_4_ = uVar11;
  auVar22._0_4_ = uVar11;
  auVar22._8_4_ = uVar11;
  auVar22._12_4_ = uVar11;
  auVar18 = vsubps_avx(auVar18,auVar22);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar52 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  auVar53 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar54 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  auVar22 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar43 = vshufps_avx(auVar22,auVar22,0);
  auVar22 = vrcpps_avx(auVar43);
  fVar21 = auVar22._0_4_;
  auVar23._0_4_ = fVar21 * auVar43._0_4_;
  fVar26 = auVar22._4_4_;
  auVar23._4_4_ = fVar26 * auVar43._4_4_;
  fVar27 = auVar22._8_4_;
  auVar23._8_4_ = fVar27 * auVar43._8_4_;
  fVar28 = auVar22._12_4_;
  auVar23._12_4_ = fVar28 * auVar43._12_4_;
  auVar43._8_4_ = 0x3f800000;
  auVar43._0_8_ = 0x3f8000003f800000;
  auVar43._12_4_ = 0x3f800000;
  auVar22 = vsubps_avx(auVar43,auVar23);
  fVar21 = fVar21 + fVar21 * auVar22._0_4_;
  fVar26 = fVar26 + fVar26 * auVar22._4_4_;
  fVar27 = fVar27 + fVar27 * auVar22._8_4_;
  fVar28 = fVar28 + fVar28 * auVar22._12_4_;
  auVar30._0_4_ = (fVar1 * auVar45._0_4_ + fVar2 * auVar29._0_4_ + fVar3 * auVar18._0_4_) * fVar21;
  auVar30._4_4_ = (fVar1 * auVar45._4_4_ + fVar2 * auVar29._4_4_ + fVar3 * auVar18._4_4_) * fVar26;
  auVar30._8_4_ = (fVar1 * auVar45._8_4_ + fVar2 * auVar29._8_4_ + fVar3 * auVar18._8_4_) * fVar27;
  auVar30._12_4_ =
       (fVar1 * auVar45._12_4_ + fVar2 * auVar29._12_4_ + fVar3 * auVar18._12_4_) * fVar28;
  auVar44._0_4_ = fVar1 * auVar30._0_4_;
  auVar44._4_4_ = fVar1 * auVar30._4_4_;
  auVar44._8_4_ = fVar1 * auVar30._8_4_;
  auVar44._12_4_ = fVar1 * auVar30._12_4_;
  auVar47._0_4_ = fVar2 * auVar30._0_4_;
  auVar47._4_4_ = fVar2 * auVar30._4_4_;
  auVar47._8_4_ = fVar2 * auVar30._8_4_;
  auVar47._12_4_ = fVar2 * auVar30._12_4_;
  auVar49._0_4_ = fVar3 * auVar30._0_4_;
  auVar49._4_4_ = fVar3 * auVar30._4_4_;
  auVar49._8_4_ = fVar3 * auVar30._8_4_;
  auVar49._12_4_ = fVar3 * auVar30._12_4_;
  auVar43 = vsubps_avx(auVar45,auVar44);
  auVar55 = ZEXT1664(auVar43);
  auVar45 = vsubps_avx(auVar29,auVar47);
  auVar56 = ZEXT1664(auVar45);
  auVar29 = vsubps_avx(auVar18,auVar49);
  auVar50 = ZEXT1664(auVar29);
  auVar36._0_4_ =
       auVar43._0_4_ * auVar43._0_4_ + auVar45._0_4_ * auVar45._0_4_ + auVar29._0_4_ * auVar29._0_4_
  ;
  auVar36._4_4_ =
       auVar43._4_4_ * auVar43._4_4_ + auVar45._4_4_ * auVar45._4_4_ + auVar29._4_4_ * auVar29._4_4_
  ;
  auVar36._8_4_ =
       auVar43._8_4_ * auVar43._8_4_ + auVar45._8_4_ * auVar45._8_4_ + auVar29._8_4_ * auVar29._8_4_
  ;
  auVar36._12_4_ =
       auVar43._12_4_ * auVar43._12_4_ +
       auVar45._12_4_ * auVar45._12_4_ + auVar29._12_4_ * auVar29._12_4_;
  auVar17._0_4_ = auVar31._0_4_ * auVar31._0_4_;
  auVar17._4_4_ = auVar31._4_4_ * auVar31._4_4_;
  auVar17._8_4_ = auVar31._8_4_ * auVar31._8_4_;
  auVar17._12_4_ = auVar31._12_4_ * auVar31._12_4_;
  auVar22 = vcmpps_avx(auVar36,auVar17,2);
  auVar18 = auVar20 & auVar22;
  if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar18[0xf] < '\0') {
    auVar22 = vandps_avx(auVar22,auVar20);
    auVar20 = vsubps_avx(auVar17,auVar36);
    auVar18._0_4_ = fVar21 * auVar20._0_4_;
    auVar18._4_4_ = fVar26 * auVar20._4_4_;
    auVar18._8_4_ = fVar27 * auVar20._8_4_;
    auVar18._12_4_ = fVar28 * auVar20._12_4_;
    auVar23 = vsqrtps_avx(auVar18);
    auVar57 = ZEXT1664(auVar23);
    auVar36 = vsubps_avx(auVar30,auVar23);
    auVar39._0_4_ = auVar23._0_4_ + auVar30._0_4_;
    auVar39._4_4_ = auVar23._4_4_ + auVar30._4_4_;
    auVar39._8_4_ = auVar23._8_4_ + auVar30._8_4_;
    auVar39._12_4_ = auVar23._12_4_ + auVar30._12_4_;
    auVar40 = ZEXT1664(auVar39);
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar31._4_4_ = uVar11;
    auVar31._0_4_ = uVar11;
    auVar31._8_4_ = uVar11;
    auVar31._12_4_ = uVar11;
    auVar20 = vcmpps_avx(auVar31,auVar36,2);
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar41._4_4_ = uVar11;
    auVar41._0_4_ = uVar11;
    auVar41._8_4_ = uVar11;
    auVar41._12_4_ = uVar11;
    auVar42 = ZEXT1664(auVar41);
    auVar18 = vcmpps_avx(auVar36,auVar41,2);
    auVar20 = vandps_avx(auVar18,auVar20);
    auVar18 = vandps_avx(auVar20,auVar22);
    auVar31 = vcmpps_avx(auVar31,auVar39,2);
    auVar17 = vcmpps_avx(auVar39,auVar41,2);
    auVar31 = vandps_avx(auVar31,auVar17);
    auVar22 = vandps_avx(auVar31,auVar22);
    auVar37 = ZEXT1664(auVar22);
    valid.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vorps_avx(auVar18,auVar22);
    if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
         || ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) ||
        ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        || valid.field_0._15_1_ < '\0') {
      auVar32._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
      auVar32._8_4_ = -auVar23._8_4_;
      auVar32._12_4_ = -auVar23._12_4_;
      aVar8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar39,auVar36,auVar18);
      auVar22 = vblendvps_avx(auVar23,auVar32,auVar18);
      fVar21 = auVar22._0_4_;
      auVar24._0_4_ = fVar1 * fVar21;
      fVar26 = auVar22._4_4_;
      auVar24._4_4_ = fVar1 * fVar26;
      fVar27 = auVar22._8_4_;
      auVar24._8_4_ = fVar1 * fVar27;
      fVar28 = auVar22._12_4_;
      auVar24._12_4_ = fVar1 * fVar28;
      auVar33._0_4_ = fVar2 * fVar21;
      auVar33._4_4_ = fVar2 * fVar26;
      auVar33._8_4_ = fVar2 * fVar27;
      auVar33._12_4_ = fVar2 * fVar28;
      auVar19._0_4_ = fVar3 * fVar21;
      auVar19._4_4_ = fVar3 * fVar26;
      auVar19._8_4_ = fVar3 * fVar27;
      auVar19._12_4_ = fVar3 * fVar28;
      hit.vNg.field_0.field_0.x.field_0 = (vfloat_impl<4>)vsubps_avx(auVar24,auVar43);
      hit.vNg.field_0.field_0.y.field_0 = (vfloat_impl<4>)vsubps_avx(auVar33,auVar45);
      hit.vNg.field_0.field_0.z.field_0 = (vfloat_impl<4>)vsubps_avx(auVar19,auVar29);
      hit.vt.field_0 = aVar8;
      auVar45._8_4_ = 0x7f800000;
      auVar45._0_8_ = 0x7f8000007f800000;
      auVar45._12_4_ = 0x7f800000;
      auVar46 = ZEXT1664(auVar45);
      auVar22 = vblendvps_avx(auVar45,(undefined1  [16])aVar8,(undefined1  [16])valid.field_0);
      auVar43 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar43 = vminps_avx(auVar43,auVar22);
      auVar45 = vshufpd_avx(auVar43,auVar43,1);
      auVar43 = vminps_avx(auVar45,auVar43);
      auVar22 = vcmpps_avx(auVar22,auVar43,0);
      auVar45 = (undefined1  [16])valid.field_0 & auVar22;
      auVar43 = vpcmpeqd_avx(auVar43,auVar43);
      if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar45[0xf] < '\0'
         ) {
        auVar43 = auVar22;
      }
      auVar22 = vandps_avx((undefined1  [16])valid.field_0,auVar43);
      uVar9 = vmovmskps_avx(auVar22);
      lVar15 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      pauVar14 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar48 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      do {
        auVar22 = auVar37._0_16_;
        auVar43 = auVar50._0_16_;
        auVar45 = auVar53._0_16_;
        args.hit = (RTCHitN *)&h;
        args.valid = (int *)local_248;
        auVar31 = auVar56._0_16_;
        auVar18 = auVar55._0_16_;
        auVar29 = auVar54._0_16_;
        auVar17 = auVar57._0_16_;
        auVar51 = auVar52._0_32_;
        uVar9 = *(uint *)(local_d8 + lVar15 * 4);
        pRVar12 = (RTCRayN *)(ulong)uVar9;
        pGVar6 = (pSVar5->geometries).items[(long)pRVar12].ptr;
        args.ray = (RTCRayN *)ray;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_248 + lVar15 * 4 + -0x10) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar4 = hit.vt.field_0.i[lVar15];
            auVar42 = ZEXT464(uVar4);
            *(uint *)(ray + k * 4 + 0x80) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0xc0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0xe0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4 + 0x20);
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar15];
            *(uint *)(ray + k * 4 + 0x120) = uVar9;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar11 = 0;
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_0076062d:
            auVar23 = vshufps_avx(auVar42._0_16_,auVar42._0_16_,0);
            hit.vt.field_0 = auVar40._0_16_;
            auVar23 = vcmpps_avx((undefined1  [16])hit.vt.field_0,auVar23,2);
            auVar20 = vandps_avx(auVar23,auVar20);
            auVar23 = auVar22 & auVar20;
            if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar23[0xf]) {
              return;
            }
            valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar20,auVar22);
            fVar1 = auVar17._0_4_;
            auVar20._0_4_ = auVar51._0_4_ * fVar1;
            fVar2 = auVar17._4_4_;
            auVar20._4_4_ = auVar51._4_4_ * fVar2;
            fVar3 = auVar17._8_4_;
            auVar20._8_4_ = auVar51._8_4_ * fVar3;
            fVar21 = auVar17._12_4_;
            auVar20._12_4_ = auVar51._12_4_ * fVar21;
            auVar25._0_4_ = auVar45._0_4_ * fVar1;
            auVar25._4_4_ = auVar45._4_4_ * fVar2;
            auVar25._8_4_ = auVar45._8_4_ * fVar3;
            auVar25._12_4_ = auVar45._12_4_ * fVar21;
            auVar35._0_4_ = auVar29._0_4_ * fVar1;
            auVar35._4_4_ = auVar29._4_4_ * fVar2;
            auVar35._8_4_ = auVar29._8_4_ * fVar3;
            auVar35._12_4_ = auVar29._12_4_ * fVar21;
            hit.vNg.field_0.field_0.x.field_0 = (vfloat_impl<4>)vsubps_avx(auVar20,auVar18);
            hit.vNg.field_0.field_0.y.field_0 = (vfloat_impl<4>)vsubps_avx(auVar25,auVar31);
            hit.vNg.field_0.field_0.z.field_0 = (vfloat_impl<4>)vsubps_avx(auVar35,auVar43);
            pSVar5 = context->scene;
            auVar22 = vblendvps_avx(auVar46._0_16_,(undefined1  [16])hit.vt.field_0,
                                    (undefined1  [16])valid.field_0);
            auVar20 = vshufps_avx(auVar22,auVar22,0xb1);
            auVar20 = vminps_avx(auVar20,auVar22);
            auVar43 = vshufpd_avx(auVar20,auVar20,1);
            auVar20 = vminps_avx(auVar43,auVar20);
            auVar22 = vcmpps_avx(auVar22,auVar20,0);
            auVar20 = (undefined1  [16])valid.field_0 & auVar22;
            aVar16 = valid.field_0;
            if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar20[0xf] < '\0') {
              aVar16 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                       vandps_avx(auVar22,(undefined1  [16])valid.field_0);
            }
            uVar10 = vmovmskps_avx((undefined1  [16])aVar16);
            lVar15 = 0;
            if (CONCAT44(uVar11,uVar10) != 0) {
              for (; (CONCAT44(uVar11,uVar10) >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
              }
            }
            auVar51 = vcmpps_avx(auVar51,auVar51,0xf);
            auVar50 = ZEXT3264(auVar51);
            auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar22 = vpcmpeqd_avx(auVar29,auVar29);
            auVar53 = ZEXT1664(auVar22);
            do {
              args.hit = (RTCHitN *)&h;
              args.valid = (int *)local_248;
              uVar9 = *(uint *)(local_d8 + lVar15 * 4);
              pRVar12 = (RTCRayN *)(ulong)uVar9;
              pGVar6 = (pSVar5->geometries).items[(long)pRVar12].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_248 + lVar15 * 4 + -0x10) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar15];
                  *(undefined4 *)(ray + k * 4 + 0xc0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4 + 0x10);
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4 + 0x20);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar15];
                  *(uint *)(ray + k * 4 + 0x120) = uVar9;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                h.geomID.field_0 =
                     (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpshufd_avx(ZEXT416(uVar9),0);
                h.primID.field_0.i[0] = *(uint *)((long)&(sphere->primIDs).field_0 + lVar15 * 4);
                h.Ng.field_0._0_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4);
                h.Ng.field_0._20_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4 + 0x10);
                uVar11 = *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4 + 0x20);
                h.Ng.field_0._36_4_ = uVar11;
                h.Ng.field_0._32_4_ = uVar11;
                h.Ng.field_0._40_4_ = uVar11;
                h.Ng.field_0._44_4_ = uVar11;
                h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._16_4_ = h.Ng.field_0._20_4_;
                h.Ng.field_0._24_4_ = h.Ng.field_0._20_4_;
                h.Ng.field_0._28_4_ = h.Ng.field_0._20_4_;
                h.u.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT816(0);
                h._48_32_ = ZEXT1632((undefined1  [16])h.u.field_0);
                h.primID.field_0.i[1] = h.primID.field_0.i[0];
                h.primID.field_0.i[2] = h.primID.field_0.i[0];
                h.primID.field_0.i[3] = h.primID.field_0.i[0];
                h.instID[0].field_0.i[1] = context->user->instID[0];
                h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar15];
                local_248 = *pauVar14;
                args.geometryUserPtr = pGVar6->userPtr;
                args.context = context->user;
                args.N = 4;
                pRVar12 = (RTCRayN *)pGVar6->intersectionFilterN;
                auVar22 = auVar40._0_16_;
                auVar20 = auVar42._0_16_;
                auVar43 = auVar48._0_16_;
                local_230 = pauVar14;
                args.ray = (RTCRayN *)ray;
                if (pRVar12 != (RTCRayN *)0x0) {
                  auVar51 = ZEXT1632(auVar50._0_16_);
                  auVar45 = auVar53._0_16_;
                  pRVar12 = (RTCRayN *)(*(code *)pRVar12)(&args);
                  auVar45 = vpcmpeqd_avx(auVar45,auVar45);
                  auVar53 = ZEXT1664(auVar45);
                  auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar51 = vcmpps_avx(auVar51,auVar51,0xf);
                  auVar50 = ZEXT3264(auVar51);
                  auVar48 = ZEXT1664(auVar43);
                  auVar42 = ZEXT1664(auVar20);
                  auVar40 = ZEXT1664(auVar22);
                }
                auVar45 = auVar53._0_16_;
                if (local_248 == (undefined1  [16])0x0) {
                  auVar22 = vpcmpeqd_avx(auVar52._0_16_,(undefined1  [16])0x0);
                  auVar45 = auVar45 ^ auVar22;
                  auVar46 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  pauVar14 = local_230;
                }
                else {
                  pRVar12 = (RTCRayN *)context->args->filter;
                  if ((pRVar12 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar51 = ZEXT1632(auVar50._0_16_);
                    pRVar12 = (RTCRayN *)(*(code *)pRVar12)(&args);
                    auVar45 = vpcmpeqd_avx(auVar45,auVar45);
                    auVar53 = ZEXT1664(auVar45);
                    auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar51 = vcmpps_avx(auVar51,auVar51,0xf);
                    auVar50 = ZEXT3264(auVar51);
                    auVar48 = ZEXT1664(auVar43);
                    auVar42 = ZEXT1664(auVar20);
                    auVar40 = ZEXT1664(auVar22);
                  }
                  auVar22 = vpcmpeqd_avx(auVar52._0_16_,local_248);
                  auVar45 = auVar53._0_16_ ^ auVar22;
                  auVar46 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  pauVar14 = local_230;
                  if (local_248 != (undefined1  [16])0x0) {
                    auVar22 = auVar53._0_16_ ^ auVar22;
                    auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])args.hit);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar20;
                    auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])(args.hit + 0x10));
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar20;
                    auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])(args.hit + 0x20));
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar20;
                    auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])(args.hit + 0x30));
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar20;
                    auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])(args.hit + 0x40));
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar20;
                    auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])(args.hit + 0x50));
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar20;
                    auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])(args.hit + 0x60));
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar20;
                    auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])(args.hit + 0x70));
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar20;
                    auVar22 = vmaskmovps_avx(auVar22,*(undefined1 (*) [16])(args.hit + 0x80));
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar22;
                    pRVar12 = args.ray;
                  }
                }
                if ((auVar48._0_16_ & auVar45) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar42._0_4_;
                }
                else {
                  auVar42 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_248 + lVar15 * 4 + -0x10) = 0;
                auVar22 = vshufps_avx(auVar42._0_16_,auVar42._0_16_,0);
                auVar22 = vcmpps_avx(auVar40._0_16_,auVar22,2);
                valid.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vandps_avx(auVar22,(undefined1  [16])valid.field_0);
              }
              if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0 &&
                   ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                   (undefined1  [16])0x0) &&
                  ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) {
                return;
              }
              auVar22 = vblendvps_avx(auVar46._0_16_,auVar40._0_16_,(undefined1  [16])valid.field_0)
              ;
              auVar20 = vshufps_avx(auVar22,auVar22,0xb1);
              auVar20 = vminps_avx(auVar20,auVar22);
              auVar43 = vshufpd_avx(auVar20,auVar20,1);
              auVar20 = vminps_avx(auVar43,auVar20);
              auVar22 = vcmpps_avx(auVar22,auVar20,0);
              auVar20 = (undefined1  [16])valid.field_0 & auVar22;
              aVar16 = valid.field_0;
              if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar20[0xf] < '\0') {
                aVar16.v = (__m128)vandps_avx(auVar22,valid.field_0);
              }
              uVar11 = vmovmskps_avx((undefined1  [16])aVar16);
              uVar13 = CONCAT44((int)((ulong)pRVar12 >> 0x20),uVar11);
              lVar15 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                }
              }
            } while( true );
          }
          h.geomID.field_0 =
               (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpshufd_avx(ZEXT416(uVar9),0);
          h.primID.field_0.i[0] = *(uint *)((long)&(sphere->primIDs).field_0 + lVar15 * 4);
          h.Ng.field_0._0_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4);
          uVar11 = *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4 + 0x10);
          aVar34.i[1] = uVar11;
          aVar34.i[0] = uVar11;
          aVar34.i[2] = uVar11;
          aVar34.i[3] = uVar11;
          h.Ng.field_0._36_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar15 * 4 + 0x20);
          h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0.field_0.y.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)aVar34;
          h.Ng.field_0._32_4_ = h.Ng.field_0._36_4_;
          h.Ng.field_0._40_4_ = h.Ng.field_0._36_4_;
          h.Ng.field_0._44_4_ = h.Ng.field_0._36_4_;
          h.u.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)SUB3216(ZEXT432(0) << 0x20,0)
          ;
          h.v.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                        SUB3216(ZEXT432(0) << 0x20,0x10);
          h.primID.field_0.i[1] = h.primID.field_0.i[0];
          h.primID.field_0.i[2] = h.primID.field_0.i[0];
          h.primID.field_0.i[3] = h.primID.field_0.i[0];
          vcmpps_avx(ZEXT1632((undefined1  [16])h.geomID.field_0),
                     ZEXT1632((undefined1  [16])h.geomID.field_0),0xf);
          h.instID[0].field_0.i[1] = context->user->instID[0];
          h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
          h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
          h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
          h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
          h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
          h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
          h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar15];
          local_248 = *pauVar14;
          args.geometryUserPtr = pGVar6->userPtr;
          args.context = context->user;
          args.N = 4;
          pRVar12 = (RTCRayN *)pGVar6->intersectionFilterN;
          auVar23 = auVar40._0_16_;
          auVar30 = auVar42._0_16_;
          auVar36 = auVar48._0_16_;
          auVar38 = auVar52._0_16_;
          if (pRVar12 != (RTCRayN *)0x0) {
            local_230 = pauVar14;
            pRVar12 = (RTCRayN *)(*(code *)pRVar12)(&args);
            auVar57 = ZEXT1664(auVar17);
            auVar50 = ZEXT1664(auVar43);
            auVar56 = ZEXT1664(auVar31);
            auVar55 = ZEXT1664(auVar18);
            auVar54 = ZEXT1664(auVar29);
            auVar53 = ZEXT1664(auVar45);
            auVar52 = ZEXT1664(auVar38);
            auVar48 = ZEXT1664(auVar36);
            auVar46 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar42 = ZEXT1664(auVar30);
            auVar40 = ZEXT1664(auVar23);
            pauVar14 = local_230;
          }
          if (local_248 == (undefined1  [16])0x0) {
            auVar43 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar43 = auVar43 ^ _DAT_01f46b70;
          }
          else {
            pRVar12 = (RTCRayN *)context->args->filter;
            if ((pRVar12 != (RTCRayN *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              pRVar12 = (RTCRayN *)(*(code *)pRVar12)(&args);
              auVar57 = ZEXT1664(auVar17);
              auVar50 = ZEXT1664(auVar43);
              auVar56 = ZEXT1664(auVar31);
              auVar55 = ZEXT1664(auVar18);
              auVar54 = ZEXT1664(auVar29);
              auVar53 = ZEXT1664(auVar45);
              auVar52 = ZEXT1664(auVar38);
              auVar48 = ZEXT1664(auVar36);
              auVar46 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar42 = ZEXT1664(auVar30);
              auVar40 = ZEXT1664(auVar23);
            }
            auVar45 = vpcmpeqd_avx(local_248,_DAT_01f45a50);
            auVar29 = vpcmpeqd_avx((undefined1  [16])aVar34,(undefined1  [16])aVar34);
            auVar43 = auVar45 ^ auVar29;
            if (local_248 != (undefined1  [16])0x0) {
              auVar45 = auVar45 ^ auVar29;
              auVar29 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])args.hit);
              *(undefined1 (*) [16])(args.ray + 0xc0) = auVar29;
              auVar29 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x10));
              *(undefined1 (*) [16])(args.ray + 0xd0) = auVar29;
              auVar29 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x20));
              *(undefined1 (*) [16])(args.ray + 0xe0) = auVar29;
              auVar29 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x30));
              *(undefined1 (*) [16])(args.ray + 0xf0) = auVar29;
              auVar29 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x40));
              *(undefined1 (*) [16])(args.ray + 0x100) = auVar29;
              auVar29 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x50));
              *(undefined1 (*) [16])(args.ray + 0x110) = auVar29;
              auVar29 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x60));
              *(undefined1 (*) [16])(args.ray + 0x120) = auVar29;
              auVar29 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x70));
              *(undefined1 (*) [16])(args.ray + 0x130) = auVar29;
              auVar45 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x80));
              *(undefined1 (*) [16])(args.ray + 0x140) = auVar45;
              pRVar12 = args.ray;
            }
          }
          auVar37 = ZEXT1664(auVar22);
          if ((auVar48._0_16_ & auVar43) == (undefined1  [16])0x0) {
            *(int *)(ray + k * 4 + 0x80) = auVar42._0_4_;
          }
          else {
            auVar42 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
          }
          *(undefined4 *)(local_248 + lVar15 * 4 + -0x10) = 0;
          auVar22 = vshufps_avx(auVar42._0_16_,auVar42._0_16_,0);
          auVar22 = vcmpps_avx((undefined1  [16])aVar8,auVar22,2);
          valid.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
               vandps_avx(auVar22,(undefined1  [16])valid.field_0);
        }
        uVar11 = (undefined4)((ulong)pRVar12 >> 0x20);
        auVar22 = auVar37._0_16_;
        auVar43 = auVar50._0_16_;
        auVar45 = auVar53._0_16_;
        auVar31 = auVar56._0_16_;
        auVar18 = auVar55._0_16_;
        auVar29 = auVar54._0_16_;
        auVar17 = auVar57._0_16_;
        auVar51 = auVar52._0_32_;
        if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0 &&
             ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
             (undefined1  [16])0x0) &&
            ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) goto LAB_0076062d;
        auVar22 = vblendvps_avx(auVar46._0_16_,(undefined1  [16])aVar8,
                                (undefined1  [16])valid.field_0);
        auVar43 = vshufps_avx(auVar22,auVar22,0xb1);
        auVar43 = vminps_avx(auVar43,auVar22);
        auVar45 = vshufpd_avx(auVar43,auVar43,1);
        auVar43 = vminps_avx(auVar45,auVar43);
        auVar22 = vcmpps_avx(auVar22,auVar43,0);
        auVar43 = (undefined1  [16])valid.field_0 & auVar22;
        aVar16 = valid.field_0;
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar43[0xf] < '\0') {
          aVar16.v = (__m128)vandps_avx(auVar22,valid.field_0);
        }
        uVar10 = vmovmskps_avx((undefined1  [16])aVar16);
        lVar15 = 0;
        if (CONCAT44(uVar11,uVar10) != 0) {
          for (; (CONCAT44(uVar11,uVar10) >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }